

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

size_t QUtil::get_max_memory_usage(void)

{
  bool bVar1;
  int iVar2;
  value_type *pvVar3;
  value_type *pvVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  char *pcVar7;
  size_t sVar8;
  bool local_3d2;
  allocator<char> local_371;
  key_type local_370;
  unsigned_long_long local_350;
  byte local_343;
  byte local_342;
  allocator<char> local_341;
  key_type local_340;
  allocator<char> local_319;
  key_type local_318;
  unsigned_long_long local_2f8;
  allocator<char> local_2e9;
  key_type local_2e8;
  string_type local_2c8;
  string_type local_2a8;
  undefined1 local_288 [8];
  sregex_iterator m2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_240;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  undefined1 local_228 [8];
  sregex_iterator a_begin;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  attrs;
  string rest;
  string tag;
  undefined1 local_170 [8];
  cregex_iterator m;
  undefined1 local_128 [4];
  int in_heap;
  sregex_iterator sr_end;
  cregex_iterator cr_end;
  cregex_iterator m_begin;
  size_t result;
  string local_58;
  FILE *local_38;
  FILE *f;
  size_t size;
  char *buf;
  char *local_10;
  
  if ((get_max_memory_usage()::tag_re_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&get_max_memory_usage()::tag_re_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&get_max_memory_usage()::tag_re_abi_cxx11_,"<(/?\\w+)([^>]*?)>",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &get_max_memory_usage()::tag_re_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&get_max_memory_usage()::tag_re_abi_cxx11_);
  }
  if ((get_max_memory_usage()::attr_re_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&get_max_memory_usage()::attr_re_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&get_max_memory_usage()::attr_re_abi_cxx11_,"(\\w+)=\"(.*?)\"",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &get_max_memory_usage()::attr_re_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&get_max_memory_usage()::attr_re_abi_cxx11_);
  }
  local_38 = open_memstream((char **)&size,(size_t *)&f);
  if (local_38 == (FILE *)0x0) {
    local_10 = (char *)0x0;
  }
  else {
    malloc_info(0,local_38);
    fclose(local_38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"QPDF_DEBUG_MEM_USAGE",(allocator<char> *)((long)&result + 7));
    bVar1 = get_env(&local_58,(string *)0x0);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)((long)&result + 7));
    if (bVar1) {
      fprintf(_stderr,"%s",size);
    }
    m_begin._M_match._M_begin = (char *)0x0;
    std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
    regex_iterator((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
                   &cr_end._M_match._M_begin,(char *)size,(char *)(f + size),
                   &get_max_memory_usage()::tag_re_abi_cxx11_,0);
    std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
    regex_iterator((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
                   &sr_end._M_match._M_begin);
    std::__cxx11::
    regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::regex_iterator((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                      *)local_128);
    m._M_match._M_begin._4_4_ = 0;
    std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
    regex_iterator((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
                   local_170,
                   (regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
                   &cr_end._M_match._M_begin);
    while (bVar1 = std::__cxx11::
                   regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::operator!=
                             ((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>
                               *)local_170,
                              (regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>
                               *)&sr_end._M_match._M_begin), bVar1) {
      pvVar3 = std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
               operator->((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
                          local_170);
      std::__cxx11::
      match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::str
                ((string_type *)((long)&rest.field_2 + 8),pvVar3,1);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&rest.field_2 + 8),"heap");
      if (bVar1) {
        m._M_match._M_begin._4_4_ = m._M_match._M_begin._4_4_ + 1;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&rest.field_2 + 8),"/heap");
        if (bVar1) {
          m._M_match._M_begin._4_4_ = m._M_match._M_begin._4_4_ + -1;
        }
        else if (m._M_match._M_begin._4_4_ == 0) {
          pvVar3 = std::__cxx11::
                   regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::operator->
                             ((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>
                               *)local_170);
          std::__cxx11::
          match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::str
                    ((string_type *)&attrs._M_t._M_impl.super__Rb_tree_header._M_node_count,pvVar3,2
                    );
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&a_begin._M_match._M_begin);
          local_238._M_current = (char *)std::__cxx11::string::begin();
          __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                    ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_230,&local_238);
          m2._M_match._M_begin._M_current = (char *)std::__cxx11::string::end();
          __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                    ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_240,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&m2._M_match._M_begin);
          std::__cxx11::
          regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
          ::regex_iterator((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                            *)local_228,local_230,local_240,
                           &get_max_memory_usage()::attr_re_abi_cxx11_,0);
          std::__cxx11::
          regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
          ::regex_iterator((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                            *)local_288,
                           (regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                            *)local_228);
          while (bVar1 = std::__cxx11::
                         regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                         ::operator!=((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                       *)local_288,
                                      (regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                       *)local_128), bVar1) {
            pvVar4 = std::__cxx11::
                     regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                     ::operator->((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                   *)local_288);
            std::__cxx11::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::str(&local_2a8,pvVar4,2);
            pvVar4 = std::__cxx11::
                     regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                     ::operator->((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                   *)local_288);
            std::__cxx11::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::str(&local_2c8,pvVar4,1);
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&a_begin._M_match._M_begin,&local_2c8);
            std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_2a8);
            std::__cxx11::string::~string((string *)&local_2c8);
            std::__cxx11::string::~string((string *)&local_2a8);
            std::__cxx11::
            regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
            ::operator++((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                          *)local_288);
          }
          std::__cxx11::
          regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
          ::~regex_iterator((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                             *)local_288);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&rest.field_2 + 8),"total");
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2e8,"size",&local_2e9);
            sVar5 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&a_begin._M_match._M_begin,&local_2e8);
            std::__cxx11::string::~string((string *)&local_2e8);
            std::allocator<char>::~allocator(&local_2e9);
            if (sVar5 != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_318,"size",&local_319);
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&a_begin._M_match._M_begin,&local_318);
              pcVar7 = (char *)std::__cxx11::string::c_str();
              local_2f8 = string_to_ull(pcVar7);
              sVar8 = QIntC::to_size<unsigned_long_long>(&local_2f8);
              m_begin._M_match._M_begin = m_begin._M_match._M_begin + sVar8;
              std::__cxx11::string::~string((string *)&local_318);
              std::allocator<char>::~allocator(&local_319);
            }
          }
          else {
            local_342 = 0;
            local_343 = 0;
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&rest.field_2 + 8),"system");
            local_3d2 = false;
            if (bVar1) {
              std::allocator<char>::allocator();
              local_342 = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_340,"type",&local_341);
              local_343 = 1;
              pmVar6 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&a_begin._M_match._M_begin,&local_340);
              local_3d2 = std::operator==(pmVar6,"max");
            }
            if ((local_343 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_340);
            }
            if ((local_342 & 1) != 0) {
              std::allocator<char>::~allocator(&local_341);
            }
            if (local_3d2 != false) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_370,"size",&local_371);
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&a_begin._M_match._M_begin,&local_370);
              pcVar7 = (char *)std::__cxx11::string::c_str();
              local_350 = string_to_ull(pcVar7);
              sVar8 = QIntC::to_size<unsigned_long_long>(&local_350);
              m_begin._M_match._M_begin = m_begin._M_match._M_begin + sVar8;
              std::__cxx11::string::~string((string *)&local_370);
              std::allocator<char>::~allocator(&local_371);
            }
          }
          std::__cxx11::
          regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
          ::~regex_iterator((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                             *)local_228);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&a_begin._M_match._M_begin);
          std::__cxx11::string::~string
                    ((string *)&attrs._M_t._M_impl.super__Rb_tree_header._M_node_count);
        }
      }
      std::__cxx11::string::~string((string *)(rest.field_2._M_local_buf + 8));
      std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
      operator++((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)local_170)
      ;
    }
    std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
    ~regex_iterator((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
                    local_170);
    std::__cxx11::
    regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_iterator((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                       *)local_128);
    std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
    ~regex_iterator((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
                    &sr_end._M_match._M_begin);
    std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
    ~regex_iterator((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
                    &cr_end._M_match._M_begin);
    free((void *)size);
    local_10 = m_begin._M_match._M_begin;
  }
  return (size_t)local_10;
}

Assistant:

size_t
QUtil::get_max_memory_usage()
{
#if defined(HAVE_MALLOC_INFO) && defined(HAVE_OPEN_MEMSTREAM)
    static std::regex tag_re("<(/?\\w+)([^>]*?)>");
    static std::regex attr_re("(\\w+)=\"(.*?)\"");

    char* buf;
    size_t size;
    FILE* f = open_memstream(&buf, &size);
    if (f == nullptr) {
        return 0;
    }
    malloc_info(0, f);
    fclose(f);
    if (QUtil::get_env("QPDF_DEBUG_MEM_USAGE")) {
        fprintf(stderr, "%s", buf);
    }

    // Warning: this code uses regular expression to extract data from an XML string. This is
    // generally a bad idea, but we're going to do it anyway because QUtil.hh warns against using
    // this function for other than development/testing, and if this function fails to generate
    // reasonable output during performance testing, it will be noticed.

    // This is my best guess at how to interpret malloc_info. Anyway it seems to provide useful
    // information for detecting code changes that drastically change memory usage.
    size_t result = 0;
    try {
        std::cregex_iterator m_begin(buf, buf + size, tag_re);
        std::cregex_iterator cr_end;
        std::sregex_iterator sr_end;

        int in_heap = 0;
        for (auto m = m_begin; m != cr_end; ++m) {
            std::string tag(m->str(1));
            if (tag == "heap") {
                ++in_heap;
            } else if (tag == "/heap") {
                --in_heap;
            } else if (in_heap == 0) {
                std::string rest = m->str(2);
                std::map<std::string, std::string> attrs;
                std::sregex_iterator a_begin(rest.begin(), rest.end(), attr_re);
                for (auto m2 = a_begin; m2 != sr_end; ++m2) {
                    attrs[m2->str(1)] = m2->str(2);
                }
                if (tag == "total") {
                    if (attrs.count("size") > 0) {
                        result += QIntC::to_size(QUtil::string_to_ull(attrs["size"].c_str()));
                    }
                } else if (tag == "system" && attrs["type"] == "max") {
                    result += QIntC::to_size(QUtil::string_to_ull(attrs["size"].c_str()));
                }
            }
        }
    } catch (...) {
        // ignore -- just return 0
    }
    free(buf);
    return result;
#else
    return 0;
#endif
}